

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus DecodeMemMMImm16(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  ushort uVar1;
  ushort uVar2;
  DecodeStatus extraout_EAX;
  MCRegisterClass *pMVar3;
  
  pMVar3 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  uVar1 = *(ushort *)((long)pMVar3->RegsBegin + (ulong)(Insn >> 0x14 & 0x3e));
  pMVar3 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  uVar2 = *(ushort *)((long)pMVar3->RegsBegin + (ulong)(Insn >> 0xf & 0x3e));
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  MCOperand_CreateReg0(Inst,(uint)uVar2);
  MCOperand_CreateImm0(Inst,(long)(short)Insn);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeMemMMImm16(MCInst *Inst,
		unsigned Insn, uint64_t Address, const MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Reg = fieldFromInstruction(Insn, 21, 5);
	unsigned Base = fieldFromInstruction(Insn, 16, 5);

	Reg = getReg(Decoder, Mips_GPR32RegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}